

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCommsInterface.cpp
# Opt level: O0

void __thiscall
helics::NetworkCommsInterface::PortAllocator::addUsedPort
          (PortAllocator *this,string_view host,int port)

{
  bool bVar1;
  iterator this_00;
  value_type_conflict1 *in_RDX;
  set<int,_std::less<int>,_std::allocator<int>_> *in_RSI;
  map<std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  *in_RDI;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar2;
  string_view sVar3;
  iterator hst;
  value_type_conflict1 *in_stack_ffffffffffffffa8;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_ffffffffffffffb0;
  value_type_conflict1 *local_48;
  PortAllocator *in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffc9;
  _Self local_28 [3];
  set<int,_std::less<int>,_std::allocator<int>_> *local_10;
  value_type_conflict1 *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDX;
  local_28[0]._M_node =
       (_Base_ptr)
       std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
       ::find(in_RDI,(key_type *)0x451e1e);
  this_00 = std::
            map<std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
            ::end(in_RDI);
  bVar1 = std::operator==(local_28,(_Self *)&stack0xffffffffffffffd0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    sVar3._M_len._1_7_ = in_stack_ffffffffffffffc9;
    sVar3._M_len._0_1_ = in_stack_ffffffffffffffc8;
    sVar3._M_str = (char *)this_00._M_node;
    in_stack_ffffffffffffffa8 = local_8;
    sVar3 = addNewHost(in_stack_ffffffffffffffc0,sVar3);
    local_10 = (set<int,_std::less<int>,_std::allocator<int>_> *)sVar3._M_len;
    local_48 = (value_type_conflict1 *)sVar3._M_str;
    local_8 = local_48;
    in_stack_ffffffffffffffb0 = local_10;
  }
  else {
    std::
    _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  *)0x451e56);
    pVar2 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    in_stack_ffffffffffffffc8 = pVar2.second;
  }
  std::
  map<std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::operator[]((map<std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                *)this_00._M_node,
               (key_type *)CONCAT71(in_stack_ffffffffffffffc9,in_stack_ffffffffffffffc8));
  std::set<int,_std::less<int>,_std::allocator<int>_>::insert
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  return;
}

Assistant:

void NetworkCommsInterface::PortAllocator::addUsedPort(std::string_view host, int port)
{
    auto hst = usedPort.find(host);
    if (hst != usedPort.end()) {
        hst->second.insert(port);
    } else {
        host = addNewHost(host);
    }
    usedPort[host].insert(port);
}